

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O1

void __thiscall
TTD::ExecutionInfoManager::SetPendingTTDToTarget
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *dsl)

{
  (this->m_pendingTTDBP).m_sourceScriptLogId = dsl->m_sourceScriptLogId;
  (this->m_pendingTTDBP).m_bpId = dsl->m_bpId;
  (this->m_pendingTTDBP).m_etime = dsl->m_etime;
  (this->m_pendingTTDBP).m_ftime = dsl->m_ftime;
  (this->m_pendingTTDBP).m_ltime = dsl->m_ltime;
  (this->m_pendingTTDBP).m_topLevelBodyId = dsl->m_topLevelBodyId;
  (this->m_pendingTTDBP).m_functionLine = dsl->m_functionLine;
  (this->m_pendingTTDBP).m_functionColumn = dsl->m_functionColumn;
  (this->m_pendingTTDBP).m_line = dsl->m_line;
  (this->m_pendingTTDBP).m_column = dsl->m_column;
  this->m_pendingTTDMoveMode = 0;
  return;
}

Assistant:

void ExecutionInfoManager::SetPendingTTDToTarget(const TTDebuggerSourceLocation& dsl)
    {
        this->m_pendingTTDBP.SetLocationCopy(dsl);

        this->m_pendingTTDMoveMode = 0;
    }